

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReader.cpp
# Opt level: O1

StepStatus __thiscall
adios2::core::engine::SscReader::BeginStep(SscReader *this,StepMode stepMode,float timeoutSeconds)

{
  element_type *peVar1;
  bool bVar2;
  char cVar3;
  StepStatus SVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  ulong uVar8;
  char cVar9;
  ScopedTimer __var260;
  string __str;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  ulong __val;
  
  if (BeginStep(adios2::StepMode,float)::__var60 == '\0') {
    iVar5 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var60);
    if (iVar5 != 0) {
      uVar7 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/ssc/SscReader.cpp"
                                  ,
                                  "virtual StepStatus adios2::core::engine::SscReader::BeginStep(StepMode, const float)"
                                  ,0x3c);
      BeginStep::__var60 = (void *)ps_timer_create_(uVar7);
      __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var60);
    }
  }
  __var260.m_timer = BeginStep::__var60;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  peVar1 = (this->m_EngineInstance).
           super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  SVar4 = (*peVar1->_vptr_SscReaderBase[2])
                    (timeoutSeconds,peVar1,stepMode,(ulong)(byte)this->field_0x83);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Engine","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"SscReader","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"BeginStep","");
  iVar5 = (*((this->m_EngineInstance).
             super___shared_ptr<adios2::core::engine::ssc::SscReaderBase,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_SscReaderBase[3])();
  __val = CONCAT44(extraout_var,iVar5);
  cVar9 = '\x01';
  if (9 < __val) {
    uVar8 = __val;
    cVar3 = '\x04';
    do {
      cVar9 = cVar3;
      if (uVar8 < 100) {
        cVar9 = cVar9 + -2;
        goto LAB_00141707;
      }
      if (uVar8 < 1000) {
        cVar9 = cVar9 + -1;
        goto LAB_00141707;
      }
      if (uVar8 < 10000) goto LAB_00141707;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar3 = cVar9 + '\x04';
    } while (bVar2);
    cVar9 = cVar9 + '\x01';
  }
LAB_00141707:
  iVar5 = 0;
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct((ulong)&__str,cVar9);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p,(uint)__str._M_string_length,__val);
  if (9 < this->m_Verbosity) {
    iVar5 = adios2::helper::Comm::Rank();
  }
  iVar6 = adios2::helper::Comm::Rank();
  adios2::helper::Log((string *)local_50,(string *)local_70,(string *)local_90,(string *)&__str,
                      iVar5,iVar6,5,this->m_Verbosity,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var260);
  return SVar4;
}

Assistant:

StepStatus SscReader::BeginStep(StepMode stepMode, const float timeoutSeconds)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    auto ret = m_EngineInstance->BeginStep(stepMode, timeoutSeconds, m_ReaderSelectionsLocked);

    helper::Log("Engine", "SscReader", "BeginStep", std::to_string(CurrentStep()),
                m_Verbosity >= 10 ? m_Comm.Rank() : 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);

    return ret;
}